

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

void digitize64(LONGLONG *a,int nx,int ny,int scale)

{
  long lVar1;
  long local_38;
  LONGLONG scale64;
  LONGLONG *p;
  LONGLONG d;
  int scale_local;
  int ny_local;
  int nx_local;
  LONGLONG *a_local;
  
  if (1 < scale) {
    lVar1 = (long)((scale + 1) / 2 + -1);
    for (p = a; p <= a + (nx * ny + -1); p = p + 1) {
      if (*p < 1) {
        local_38 = *p - lVar1;
      }
      else {
        local_38 = *p + lVar1;
      }
      *p = local_38 / (long)scale;
    }
  }
  return;
}

Assistant:

static void  
digitize64(LONGLONG a[], int nx, int ny, int scale)
{
LONGLONG d, *p, scale64;

	/*
	 * round to multiple of scale
	 */
	if (scale <= 1) return;
	d=(scale+1)/2-1;
	scale64 = scale;  /* use a 64-bit int for efficiency in the big loop */

	for (p=a; p <= &a[nx*ny-1]; p++) *p = ((*p>0) ? (*p+d) : (*p-d))/scale64;
}